

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<double,_std::allocator<double>_> *
mult_matrix_on_constant<double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *a,double *C)

{
  pointer pdVar1;
  pointer pdVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  allocator_type local_21;
  
  uVar4 = (ulong)((long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar3 = (int)uVar4;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(long)iVar3,&local_21)
  ;
  pdVar1 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pdVar2[uVar5] = pdVar1[uVar5] * *C;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> mult_matrix_on_constant(const std::vector<T>& a, const T& C){
    int n = a.size();
    std::vector<T> ans(n);
    for (int i = 0; i < n; ++i)
        ans[i] = a[i]*C;
    return ans;
}